

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
poplar::
compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::get_parent_and_symb
          (compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint64_t node_id)

{
  pointer puVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  
  uVar5 = (this->table_).width_;
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = uVar5 * node_id;
  uVar8 = (ulong)((uint)uVar7 & 0x3f);
  uVar6 = puVar1[uVar7 >> 6];
  if (uVar5 + uVar8 < 0x41) {
    uVar3 = (uint)(uVar6 >> uVar8);
  }
  else {
    bVar2 = (byte)uVar7 & 0x3f;
    uVar3 = (uint)(uVar6 >> bVar2) | (uint)(puVar1[(uVar7 >> 6) + 1] << 0x40 - bVar2);
  }
  if ((uVar3 & (uint)(this->table_).mask_ & 0xf) == 0) {
    uVar6 = 0xffffffffffffffff;
    uVar7 = 0;
  }
  else {
    uVar4 = get_dsp_(this,node_id);
    uVar5 = (this->table_).width_;
    puVar1 = (this->table_).chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (node_id - uVar4) + 1 + (this->table_).size_;
    if (uVar4 - 1 <= node_id) {
      uVar6 = node_id - (uVar4 - 1);
    }
    uVar9 = node_id * uVar5;
    uVar8 = (ulong)((uint)uVar9 & 0x3f);
    uVar7 = puVar1[uVar9 >> 6];
    if (uVar5 + uVar8 < 0x41) {
      uVar7 = uVar7 >> uVar8;
    }
    else {
      bVar2 = (byte)uVar9 & 0x3f;
      uVar7 = uVar7 >> bVar2 | puVar1[(uVar9 >> 6) + 1] << 0x40 - bVar2;
    }
    uVar5 = bijective_hash::split_mix_hasher::hash_inv
                      (&this->hasher_,
                       ((uVar7 & (this->table_).mask_) >> 4) <<
                       ((ulong)(byte)(this->capa_size_).bits_ & 0x3f) | uVar6);
    uVar6 = uVar5 >> ((ulong)(byte)(this->symb_size_).bits_ & 0x3f);
    uVar7 = uVar5 & (this->symb_size_).mask_;
  }
  pVar10.second = uVar7;
  pVar10.first = uVar6;
  return pVar10;
}

Assistant:

std::pair<uint64_t, uint64_t> get_parent_and_symb(uint64_t node_id) const {
        assert(node_id < capa_size_.size());

        if (compare_dsp_(node_id, 0)) {
            // root or not exist
            return {nil_id, 0};
        }

        uint64_t dist = get_dsp_(node_id) - 1;
        uint64_t init_id = dist <= node_id ? node_id - dist : table_.size() - (dist - node_id);
        uint64_t key = hasher_.hash_inv(get_quo_(node_id) << capa_size_.bits() | init_id);

        // Returns pair (parent, label)
        return std::make_pair(key >> symb_size_.bits(), key & symb_size_.mask());
    }